

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O2

HdlcByte * __thiscall
HdlcAnalyzer::ByteAsyncProcessFlags(HdlcByte *__return_storage_ptr__,HdlcAnalyzer *this)

{
  U64 UVar1;
  undefined6 uVar2;
  bool bVar3;
  bool bVar4;
  vector<HdlcByte,_std::allocator<HdlcByte>_> readBytes;
  HdlcByte asyncByte;
  _Vector_base<HdlcByte,_std::allocator<HdlcByte>_> local_98;
  _Vector_base<HdlcByte,_std::allocator<HdlcByte>_> local_78;
  _Vector_base<HdlcByte,_std::allocator<HdlcByte>_> local_60;
  HdlcByte local_48;
  
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar3 = false;
  do {
    ReadByte(&local_48,this);
    bVar4 = local_48.value == '~';
    if (bVar4) {
      std::vector<HdlcByte,_std::allocator<HdlcByte>_>::push_back
                ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)&local_98,&local_48);
    }
    else if (bVar3) {
      std::vector<HdlcByte,_std::allocator<HdlcByte>_>::push_back
                ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)&local_98,&local_48);
      std::vector<HdlcByte,_std::allocator<HdlcByte>_>::vector
                ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)&local_78,
                 (vector<HdlcByte,_std::allocator<HdlcByte>_> *)&local_98);
      GenerateFlagsFrames(this,(vector<HdlcByte,_std::allocator<HdlcByte>_> *)&local_78);
      std::_Vector_base<HdlcByte,_std::allocator<HdlcByte>_>::~_Vector_base(&local_78);
      bVar3 = local_98._M_impl.super__Vector_impl_data._M_finish[-1].escaped;
      uVar2 = *(undefined6 *)&local_98._M_impl.super__Vector_impl_data._M_finish[-1].field_0x12;
      __return_storage_ptr__->value = local_98._M_impl.super__Vector_impl_data._M_finish[-1].value;
      __return_storage_ptr__->escaped = bVar3;
      *(undefined6 *)&__return_storage_ptr__->field_0x12 = uVar2;
      UVar1 = local_98._M_impl.super__Vector_impl_data._M_finish[-1].endSample;
      __return_storage_ptr__->startSample =
           local_98._M_impl.super__Vector_impl_data._M_finish[-1].startSample;
      __return_storage_ptr__->endSample = UVar1;
      goto LAB_00109db6;
    }
    bVar3 = bVar4;
  } while (this->mAbortFrame != true);
  std::vector<HdlcByte,_std::allocator<HdlcByte>_>::vector
            ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)&local_60,
             (vector<HdlcByte,_std::allocator<HdlcByte>_> *)&local_98);
  GenerateFlagsFrames(this,(vector<HdlcByte,_std::allocator<HdlcByte>_> *)&local_60);
  std::_Vector_base<HdlcByte,_std::allocator<HdlcByte>_>::~_Vector_base(&local_60);
  __return_storage_ptr__->startSample = 0;
  __return_storage_ptr__->endSample = 0;
  __return_storage_ptr__->value = '\0';
LAB_00109db6:
  std::_Vector_base<HdlcByte,_std::allocator<HdlcByte>_>::~_Vector_base(&local_98);
  return __return_storage_ptr__;
}

Assistant:

HdlcByte HdlcAnalyzer::ByteAsyncProcessFlags()
{
    bool flagEncountered = false;
    // Read bytes until non-flag byte
    vector<HdlcByte> readBytes;

    for( ;; )
    {
        HdlcByte asyncByte = ReadByte();
        if( ( asyncByte.value != HDLC_FLAG_VALUE ) && flagEncountered )
        {
            readBytes.push_back( asyncByte );
            break;
        }
        else if( asyncByte.value == HDLC_FLAG_VALUE )
        {
            readBytes.push_back( asyncByte );
            flagEncountered = true;
        }
        if( mAbortFrame )
        {
            GenerateFlagsFrames( readBytes );
            HdlcByte b;
            b.startSample = 0;
            b.endSample = 0;
            b.value = 0;
            return b;
        }
    }

    GenerateFlagsFrames( readBytes );

    HdlcByte nonFlagByte = readBytes.back();
    return nonFlagByte;
}